

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O2

int vardata_add_mode(vardata *data,char *name,char *description,int modeset)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  vardata_mode *pvVar5;
  int iVar6;
  
  if (data->validated == 0) {
    iVar1 = symtab_put(data->symtab,name,3,data->modesnum);
    if (iVar1 == -1) {
      iVar1 = -1;
    }
    else {
      iVar1 = data->modesnum;
      pcVar3 = strdup(name);
      if (description == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = strdup(description);
      }
      iVar6 = data->modesmax;
      if (iVar1 < iVar6) {
        pvVar5 = data->modes;
        iVar6 = iVar1;
      }
      else {
        iVar2 = 0x10;
        if (iVar6 != 0) {
          iVar2 = iVar6 * 2;
        }
        data->modesmax = iVar2;
        pvVar5 = (vardata_mode *)realloc(data->modes,(long)iVar2 * 0x30);
        data->modes = pvVar5;
        iVar6 = data->modesnum;
      }
      data->modesnum = iVar6 + 1;
      pvVar5[iVar6].name = pcVar3;
      pvVar5[iVar6].description = pcVar4;
      pvVar5[iVar6].rfmask = (uint32_t *)0x0;
      (&pvVar5[iVar6].rfmask)[1] = (uint32_t *)0x0;
      pvVar5[iVar6].rfeaturesnum = 0;
      pvVar5[iVar6].rfeaturesmax = 0;
      pvVar5[iVar6].modeset = modeset;
      *(undefined4 *)&pvVar5[iVar6].field_0x2c = 0;
    }
    return iVar1;
  }
  abort();
}

Assistant:

int vardata_add_mode(struct vardata *data, const char *name, const char *description, int modeset) {
	if (data->validated)
		abort();
	if (symtab_put(data->symtab, name, VARDATA_ST_MODE, data->modesnum) == -1)
		return -1;
	int res = data->modesnum;
	struct vardata_mode new = { strdup(name), .modeset = modeset };
	if (description)
		new.description = strdup(description);
	ADDARRAY(data->modes, new);
	return res;
}